

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample *sample,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  Float FVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  ulong uVar5;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  short sVar11;
  Tuple2<pbrt::Point2,_float> TVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  CameraSample sample_03;
  CameraSample sample_04;
  CameraSample sample_05;
  CameraSample sample_06;
  CameraSample sample_07;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  bool bVar26;
  PerspectiveCamera *pPVar27;
  long lVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  optional<pbrt::CameraRay> cr;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  float local_168 [4];
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_158;
  char local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  anon_struct_8_0_00000001_for___align local_108;
  undefined8 uStack_100;
  Tuple2<pbrt::Point2,_float> local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  optional<pbrt::CameraRayDifferential> *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_78;
  char local_40;
  
  uVar4 = sample->time;
  uVar6 = sample->weight;
  local_158.__align =
       (anon_struct_8_0_00000001_for___align)(sample->pFilm).super_Tuple2<pbrt::Point2,_float>;
  TVar12 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
  local_158._8_4_ = TVar12.x;
  local_158._12_4_ = TVar12.y;
  uVar5 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  pPVar27 = (PerspectiveCamera *)(uVar5 & 0xffffffffffff);
  sVar11 = (short)(uVar5 >> 0x30);
  local_158._16_4_ = uVar4;
  local_158._20_4_ = uVar6;
  if (uVar5 >> 0x30 < 3) {
    if (sVar11 == 2) {
      OrthographicCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_78.__align,(OrthographicCamera *)pPVar27,
                 *sample,(SampledWavelengths *)sample);
    }
    else {
      PerspectiveCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_78.__align,pPVar27,*sample,
                 (SampledWavelengths *)sample);
    }
  }
  else if (sVar11 == 3) {
    SphericalCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_78.__align,(SphericalCamera *)pPVar27,*sample,
               (SampledWavelengths *)sample);
  }
  else {
    RealisticCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_78.__align,(RealisticCamera *)pPVar27,*sample,
               (SampledWavelengths *)sample);
  }
  local_b0 = __return_storage_ptr__;
  if (local_40 == '\0') {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_108 = local_78.__align;
    uStack_100 = local_78._8_8_;
    local_118 = local_78._16_8_;
    uStack_110 = 0;
    local_168[3] = (float)local_78._24_4_;
    local_b8 = local_78._32_8_;
    local_168[0] = 0.05;
    local_168[1] = -0.05;
    lVar28 = 0;
    bVar26 = false;
    do {
      local_c8 = ZEXT416((uint)*(float *)((long)local_168 + lVar28));
      fVar7 = *(float *)((long)local_168 + lVar28) +
              (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      FVar2 = sample->weight;
      uVar1 = *(undefined8 *)&(sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      uVar13 = *(undefined8 *)&(sample->pLens).super_Tuple2<pbrt::Point2,_float>.y;
      uStack_17c = (undefined4)uVar1;
      uStack_178 = (undefined4)((ulong)uVar1 >> 0x20);
      uStack_174 = (undefined4)uVar13;
      uStack_170 = (undefined4)((ulong)uVar13 >> 0x20);
      uVar5 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar27 = (PerspectiveCamera *)(uVar5 & 0xffffffffffff);
      sVar11 = (short)(uVar5 >> 0x30);
      if (uVar5 < 0x3000000000000) {
        if (sVar11 == 2) {
          sample_00.weight = FVar2;
          sample_00.time = (Float)uStack_170;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_17c;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_174;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_178;
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_158.__align,(OrthographicCamera *)pPVar27,
                     sample_00,(SampledWavelengths *)0x3000000000000);
        }
        else {
          sample_02.weight = FVar2;
          sample_02.time = (Float)uStack_170;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_17c;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_174;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_178;
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_158.__align,pPVar27,sample_02,
                     (SampledWavelengths *)0x3000000000000);
        }
      }
      else if (sVar11 == 3) {
        sample_01.weight = FVar2;
        sample_01.time = (Float)uStack_170;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_17c;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_174;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_178;
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_158.__align,(SphericalCamera *)pPVar27,
                   sample_01,(SampledWavelengths *)0x3000000000000);
      }
      else {
        sample_03.weight = FVar2;
        sample_03.time = (Float)uStack_170;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_17c;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_174;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)uStack_178;
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_158.__align,(RealisticCamera *)pPVar27,
                   sample_03,(SampledWavelengths *)0x3000000000000);
      }
      if (bVar26) {
        bVar26 = false;
      }
      if (local_120 == '\x01') {
        local_f8 = (Tuple2<pbrt::Point2,_float>)local_158.__align;
        uStack_f0 = 0;
        local_d8 = CONCAT44(local_158._16_4_,local_158._12_4_);
        uStack_d0 = 0;
        auVar9._4_12_ = local_158._24_12_;
        auVar9._0_4_ = local_158._20_4_;
        local_120 = '\0';
        local_e8 = vinsertps_avx(auVar9,ZEXT416((uint)local_158._8_4_),0x10);
        bVar26 = true;
      }
      if (bVar26 != false) {
        auVar30._8_8_ = uStack_100;
        auVar30._0_8_ = local_108;
        auVar31._8_8_ = uStack_f0;
        auVar31._0_4_ = local_f8.x;
        auVar31._4_4_ = local_f8.y;
        auVar9 = vsubps_avx(auVar31,auVar30);
        auVar33._4_4_ = local_c8._0_4_;
        auVar33._0_4_ = local_c8._0_4_;
        auVar33._8_4_ = local_c8._0_4_;
        auVar33._12_4_ = local_c8._0_4_;
        auVar9 = vdivps_avx(auVar9,auVar33);
        local_88 = local_108._0_4_ + auVar9._0_4_;
        fStack_84 = local_108._4_4_ + auVar9._4_4_;
        fStack_80 = (float)uStack_100 + auVar9._8_4_;
        fStack_7c = (float)((ulong)uStack_100 >> 0x20) + auVar9._12_4_;
        auVar10._8_8_ = uStack_110;
        auVar10._0_8_ = local_118;
        auVar31 = vpermi2ps_avx512vl(_DAT_028d6470,auVar30,auVar10);
        auVar9 = vsubps_avx(local_e8,auVar31);
        auVar9 = vdivps_avx(auVar9,auVar33);
        auVar30 = vpermi2ps_avx512vl(_DAT_028d6480,auVar10,auVar30);
        auVar21._8_8_ = uStack_d0;
        auVar21._0_8_ = local_d8;
        auVar10 = vsubps_avx(auVar21,auVar30);
        auVar10 = vdivps_avx(auVar10,auVar33);
        local_98 = auVar30._0_4_ + auVar10._0_4_;
        fStack_94 = auVar30._4_4_ + auVar10._4_4_;
        fStack_90 = auVar30._8_4_ + auVar10._8_4_;
        fStack_8c = auVar30._12_4_ + auVar10._12_4_;
        local_a8 = auVar31._0_4_ + auVar9._0_4_;
        fStack_a4 = auVar31._4_4_ + auVar9._4_4_;
        fStack_a0 = auVar31._8_4_ + auVar9._8_4_;
        fStack_9c = auVar31._12_4_ + auVar9._12_4_;
        goto LAB_0034bc8a;
      }
      lVar28 = lVar28 + 4;
    } while (lVar28 != 8);
    local_a8 = 0.0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
    local_88 = 0.0;
    fStack_84 = 0.0;
    fStack_80 = 0.0;
    fStack_7c = 0.0;
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
LAB_0034bc8a:
    local_168[0] = 0.05;
    local_168[1] = -0.05;
    lVar28 = 0;
    bVar29 = 0;
    do {
      fVar7 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      local_c8 = ZEXT416((uint)*(float *)((long)local_168 + lVar28));
      fVar8 = *(float *)((long)local_168 + lVar28) +
              (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      TVar12 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
      uVar14 = sample->time;
      uVar15 = sample->weight;
      sample_07.weight = (Float)uVar15;
      sample_07.time = (Float)uVar14;
      uVar5 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar27 = (PerspectiveCamera *)(uVar5 & 0xffffffffffff);
      sVar11 = (short)(uVar5 >> 0x30);
      if (uVar5 < 0x3000000000000) {
        if (sVar11 == 2) {
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar8;
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float> = TVar12;
          sample_04.time = (Float)uVar14;
          sample_04.weight = (Float)uVar15;
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_158.__align,(OrthographicCamera *)pPVar27,
                     sample_04,(SampledWavelengths *)0x3000000000000);
        }
        else {
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar8;
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float> = TVar12;
          sample_06.time = (Float)uVar14;
          sample_06.weight = (Float)uVar15;
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_158.__align,pPVar27,sample_06,
                     (SampledWavelengths *)0x3000000000000);
        }
      }
      else if (sVar11 == 3) {
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar8;
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float> = TVar12;
        sample_05.time = (Float)uVar14;
        sample_05.weight = (Float)uVar15;
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_158.__align,(SphericalCamera *)pPVar27,
                   sample_05,(SampledWavelengths *)0x3000000000000);
      }
      else {
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar8;
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar7;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float> = TVar12;
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_158.__align,(RealisticCamera *)pPVar27,
                   sample_07,(SampledWavelengths *)0x3000000000000);
      }
      if (bVar29 != 0) {
        bVar29 = 0;
      }
      if (local_120 == '\x01') {
        local_f8 = (Tuple2<pbrt::Point2,_float>)local_158.__align;
        uStack_f0 = 0;
        local_d8 = CONCAT44(local_158._16_4_,local_158._12_4_);
        uStack_d0 = 0;
        auVar16._4_12_ = local_158._24_12_;
        auVar16._0_4_ = local_158._20_4_;
        local_120 = '\0';
        local_e8 = vinsertps_avx(auVar16,ZEXT416((uint)local_158._8_4_),0x10);
        bVar29 = 1;
      }
      if (bVar29 != 0) {
        auVar19._8_8_ = uStack_100;
        auVar19._0_8_ = local_108;
        auVar20._8_8_ = uStack_f0;
        auVar20._0_4_ = local_f8.x;
        auVar20._4_4_ = local_f8.y;
        auVar9 = vsubps_avx(auVar20,auVar19);
        auVar35._4_4_ = local_c8._0_4_;
        auVar35._0_4_ = local_c8._0_4_;
        auVar35._8_4_ = local_c8._0_4_;
        auVar35._12_4_ = local_c8._0_4_;
        auVar9 = vdivps_avx(auVar9,auVar35);
        auVar32._0_4_ = local_108._0_4_ + auVar9._0_4_;
        auVar32._4_4_ = local_108._4_4_ + auVar9._4_4_;
        auVar32._8_4_ = (float)uStack_100 + auVar9._8_4_;
        auVar32._12_4_ = (float)((ulong)uStack_100 >> 0x20) + auVar9._12_4_;
        auVar17._8_8_ = uStack_110;
        auVar17._0_8_ = local_118;
        auVar30 = vpermi2ps_avx512vl(_DAT_028d6470,auVar19,auVar17);
        auVar9 = vsubps_avx(local_e8,auVar30);
        auVar9 = vdivps_avx(auVar9,auVar35);
        auVar31 = vpermi2ps_avx512vl(_DAT_028d6480,auVar17,auVar19);
        auVar22._8_8_ = uStack_d0;
        auVar22._0_8_ = local_d8;
        auVar10 = vsubps_avx(auVar22,auVar31);
        auVar10 = vdivps_avx(auVar10,auVar35);
        auVar34._0_4_ = auVar31._0_4_ + auVar10._0_4_;
        auVar34._4_4_ = auVar31._4_4_ + auVar10._4_4_;
        auVar34._8_4_ = auVar31._8_4_ + auVar10._8_4_;
        auVar34._12_4_ = auVar31._12_4_ + auVar10._12_4_;
        auVar36._0_4_ = auVar30._0_4_ + auVar9._0_4_;
        auVar36._4_4_ = auVar30._4_4_ + auVar9._4_4_;
        auVar36._8_4_ = auVar30._8_4_ + auVar9._8_4_;
        auVar36._12_4_ = auVar30._12_4_ + auVar9._12_4_;
        goto LAB_0034be82;
      }
      lVar28 = lVar28 + 4;
    } while (lVar28 != 8);
    auVar32 = ZEXT816(0) << 0x40;
    auVar34 = ZEXT816(0) << 0x40;
    auVar36 = ZEXT816(0) << 0x40;
LAB_0034be82:
    if (local_40 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f68b4d);
    }
    local_b0->set = true;
    *(anon_struct_8_0_00000001_for___align *)&local_b0->optionalValue = local_108;
    *(undefined8 *)((long)&local_b0->optionalValue + 8) = uStack_100;
    auVar18._8_8_ = uStack_110;
    auVar18._0_8_ = local_118;
    uVar1 = vmovlps_avx(auVar18);
    *(undefined8 *)((long)&local_b0->optionalValue + 0x10) = uVar1;
    *(float *)((long)&local_b0->optionalValue + 0x18) = local_168[3];
    *(undefined8 *)((long)&local_b0->optionalValue + 0x20) = local_b8;
    (local_b0->optionalValue).__data[0x28] = bVar26 & bVar29;
    auVar25._4_4_ = fStack_84;
    auVar25._0_4_ = local_88;
    auVar25._8_4_ = fStack_80;
    auVar25._12_4_ = fStack_7c;
    uVar1 = vmovlps_avx(auVar25);
    *(undefined8 *)((long)&local_b0->optionalValue + 0x2c) = uVar1;
    auVar23._4_4_ = fStack_a4;
    auVar23._0_4_ = local_a8;
    auVar23._8_4_ = fStack_a0;
    auVar23._12_4_ = fStack_9c;
    uVar3 = vextractps_avx(auVar23,1);
    *(undefined4 *)((long)&local_b0->optionalValue + 0x34) = uVar3;
    uVar1 = vmovlps_avx(auVar32);
    *(undefined8 *)((long)&local_b0->optionalValue + 0x38) = uVar1;
    uVar3 = vextractps_avx(auVar36,1);
    *(undefined4 *)((long)&local_b0->optionalValue + 0x40) = uVar3;
    auVar24._4_4_ = fStack_94;
    auVar24._0_4_ = local_98;
    auVar24._8_4_ = fStack_90;
    auVar24._12_4_ = fStack_8c;
    uVar1 = vmovlps_avx(auVar24);
    *(undefined8 *)((long)&local_b0->optionalValue + 0x44) = uVar1;
    *(float *)((long)&local_b0->optionalValue + 0x4c) = local_a8;
    uVar1 = vmovlps_avx(auVar34);
    *(undefined8 *)((long)&local_b0->optionalValue + 0x50) = uVar1;
    *(int *)((long)&local_b0->optionalValue + 0x58) = auVar36._0_4_;
    *(undefined8 *)((long)&local_b0->optionalValue + 0x60) = local_78._40_8_;
    *(undefined8 *)((long)&local_b0->optionalValue + 0x68) = local_78._48_8_;
  }
  return local_b0;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, const CameraSample &sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}